

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O2

void __thiscall cmFileInstaller::~cmFileInstaller(cmFileInstaller *this)

{
  ~cmFileInstaller(this);
  operator_delete(this,0x140);
  return;
}

Assistant:

cmFileInstaller::~cmFileInstaller()
{
  // Save the updated install manifest.
  this->Makefile->AddDefinition("CMAKE_INSTALL_MANIFEST_FILES",
                                this->Manifest.c_str());
}